

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

value_type __thiscall
andres::
BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>
::operator()(BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>
             *this,size_t c0,size_t c1,size_t c2)

{
  int iVar1;
  reference x;
  reference y;
  size_t c2_local;
  size_t c1_local;
  size_t c0_local;
  BinaryViewExpression<andres::View<short,_false,_std::allocator<unsigned_long>_>,_short,_andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Minus<short,_int,_int>_>
  *this_local;
  
  x = View<short,false,std::allocator<unsigned_long>>::operator()
                ((View<short,false,std::allocator<unsigned_long>> *)this->e1_,c0,c1,c2);
  y = View<int,false,std::allocator<unsigned_long>>::operator()
                ((View<int,false,std::allocator<unsigned_long>> *)this->e2_,c0,c1,c2);
  iVar1 = marray_detail::Minus<short,_int,_int>::operator()
                    ((Minus<short,_int,_int> *)&this->field_0x10,x,y);
  return iVar1;
}

Assistant:

const value_type operator()(const std::size_t c0, const std::size_t c1, const std::size_t c2) const 
        { return binaryFunctor_(e1_(c0, c1, c2), e2_(c0, c1, c2)); }